

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

int __thiscall
lzham::lzcompressor::enumerate_lz_decisions
          (lzcompressor *this,uint ofs,state *cur_state,
          vector<lzham::lzcompressor::lzpriced_decision> *decisions,uint min_match_len,
          uint max_match_len)

{
  uint uVar1;
  lzpriced_decision *plVar2;
  uchar *puVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  dict_match *pdVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  lzpriced_decision dec;
  uint local_88;
  uint local_70;
  bit_cost_t local_68;
  lzdecision local_58;
  undefined4 uStack_4c;
  bit_cost_t local_48;
  uint local_3c;
  search_accelerator *local_38;
  
  local_38 = &this->m_accel;
  uVar8 = (this->m_accel).m_max_dict_size_mask;
  uVar14 = (this->m_accel).m_lookahead_pos;
  uVar12 = decisions->m_size;
  uVar11 = (uint)decisions;
  if (min_match_len < 2) {
    if (uVar12 != 1) {
      if ((uVar12 == 0 && decisions->m_capacity == 0) &&
         (cVar5 = lzham::elemental_vector::increase_capacity
                            (uVar11,true,1,(_func_void_void_ptr_void_ptr_uint *)0x18,true),
         cVar5 == '\0')) {
        return -1;
      }
      decisions->m_size = 1;
    }
    plVar2 = decisions->m_p;
    (plVar2->super_lzdecision).m_pos = ofs;
    (plVar2->super_lzdecision).m_len = 0;
    (plVar2->super_lzdecision).m_dist = 0;
    *(bit_cost_t *)(&plVar2->field_0xc + 4) = 0;
    local_68 = state::get_cost(cur_state,&this->super_CLZBase,local_38,&plVar2->super_lzdecision);
    *(bit_cost_t *)(&plVar2->field_0xc + 4) = local_68;
    local_88 = 1;
  }
  else {
    local_68 = 0xffffffffffffffff;
    local_88 = 0;
    if (uVar12 != 0) {
      decisions->m_size = 0;
    }
  }
  uVar12 = ofs - (uVar8 & uVar14);
  uVar13 = (ulong)max_match_len;
  uVar9 = 0;
  bVar16 = false;
  uVar8 = 0;
  local_70 = 0;
  do {
    uVar1 = (cur_state->super_state_base).m_match_hist[uVar9];
    uVar15 = 0;
    if (((int)uVar1 <= (int)((this->m_accel).m_cur_dict_size + uVar12)) &&
       (uVar15 = 0, max_match_len != 0)) {
      uVar6 = (this->m_accel).m_lookahead_pos + uVar12;
      uVar14 = (this->m_accel).m_max_dict_size_mask;
      puVar3 = (this->m_accel).m_dict.m_p;
      uVar10 = 0;
      do {
        uVar15 = uVar10;
        if (puVar3[uVar10 + (uVar6 - uVar1 & uVar14)] != puVar3[uVar10 + (uVar6 & uVar14)]) break;
        uVar10 = uVar10 + 1;
        uVar15 = uVar13;
      } while (uVar13 != uVar10);
    }
    bVar4 = false;
    uVar14 = (uint)uVar15;
    if (min_match_len <= uVar14) {
      if ((1 < uVar14) || (bVar4 = false, uVar9 == 0 && uVar14 == 1)) {
        if (uVar8 <= uVar14) {
          uVar8 = uVar14;
        }
        local_58.m_dist = ~(uint)uVar9;
        local_58.m_pos = ofs;
        local_58.m_len = uVar14;
        local_48 = state::get_cost(cur_state,&this->super_CLZBase,local_38,&local_58);
        if ((decisions->m_size < decisions->m_capacity) ||
           (cVar5 = lzham::elemental_vector::increase_capacity
                              (uVar11,(bool)((char)decisions->m_size + '\x01'),1,
                               (_func_void_void_ptr_void_ptr_uint *)0x18,true), cVar5 != '\0')) {
          plVar2 = decisions->m_p;
          uVar6 = decisions->m_size;
          plVar2[uVar6].m_cost = local_48;
          plVar2 = plVar2 + uVar6;
          (plVar2->super_lzdecision).m_pos = local_58.m_pos;
          (plVar2->super_lzdecision).m_len = local_58.m_len;
          *(ulong *)&(plVar2->super_lzdecision).m_dist = CONCAT44(uStack_4c,local_58.m_dist);
          decisions->m_size = decisions->m_size + 1;
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
        if ((bVar4) && ((local_88 < uVar14 || ((uVar14 == local_88 && (local_48 < local_68)))))) {
          local_70 = decisions->m_size - 1;
          local_68 = local_48;
          local_88 = uVar14;
        }
        bVar4 = (bool)(bVar4 ^ 1);
      }
    }
    if (bVar4) break;
    bVar16 = 2 < uVar9;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 4);
  uVar14 = 0xffffffff;
  if ((((bVar16) && (uVar14 = local_70, 1 < max_match_len)) && (uVar8 < this->m_fast_bytes)) &&
     (local_3c = uVar8, pdVar7 = search_accelerator::find_matches(local_38,uVar12,true),
     uVar8 = local_3c, pdVar7 != (dict_match *)0x0)) {
    do {
      uVar14 = pdVar7->m_len + 2;
      if (max_match_len <= uVar14) {
        uVar14 = max_match_len;
      }
      if ((uVar14 < min_match_len) || (uVar14 <= uVar8)) {
LAB_001094b8:
        uVar6 = (int)pdVar7->m_dist >> 0x1f & 5;
        uVar14 = local_70;
        if (-1 < (int)pdVar7->m_dist) {
          pdVar7 = pdVar7 + 1;
        }
      }
      else {
        uVar9 = (ulong)uVar14;
        if ((0x101 < max_match_len) && (uVar14 == 0x101)) {
          uVar8 = pdVar7->m_dist & 0x7fffffff;
          uVar9 = 0;
          if ((int)uVar8 <= (int)((this->m_accel).m_cur_dict_size + uVar12)) {
            uVar6 = (this->m_accel).m_lookahead_pos + uVar12;
            uVar14 = (this->m_accel).m_max_dict_size_mask;
            puVar3 = (this->m_accel).m_dict.m_p;
            uVar15 = 0x101;
            do {
              uVar9 = uVar15;
              if (puVar3[uVar15 + (uVar6 - uVar8 & uVar14)] != puVar3[uVar15 + (uVar6 & uVar14)])
              break;
              uVar15 = uVar15 + 1;
              uVar9 = uVar13;
            } while (uVar13 != uVar15);
          }
        }
        local_58.m_dist = pdVar7->m_dist & 0x7fffffff;
        uVar8 = (uint)uVar9;
        local_58.m_pos = ofs;
        local_58.m_len = uVar8;
        local_48 = state::get_cost(cur_state,&this->super_CLZBase,local_38,&local_58);
        if ((decisions->m_size < decisions->m_capacity) ||
           (cVar5 = lzham::elemental_vector::increase_capacity
                              (uVar11,(bool)((char)decisions->m_size + '\x01'),1,
                               (_func_void_void_ptr_void_ptr_uint *)0x18,true), cVar5 != '\0')) {
          plVar2 = decisions->m_p;
          uVar14 = decisions->m_size;
          plVar2[uVar14].m_cost = local_48;
          plVar2 = plVar2 + uVar14;
          (plVar2->super_lzdecision).m_pos = local_58.m_pos;
          (plVar2->super_lzdecision).m_len = local_58.m_len;
          *(ulong *)&(plVar2->super_lzdecision).m_dist = CONCAT44(uStack_4c,local_58.m_dist);
          decisions->m_size = decisions->m_size + 1;
          bVar16 = true;
        }
        else {
          bVar16 = false;
        }
        if ((bVar16) && ((local_88 < uVar8 || ((uVar8 == local_88 && (local_48 < local_68)))))) {
          local_70 = decisions->m_size - 1;
          local_68 = local_48;
          local_88 = uVar8;
        }
        uVar6 = 1;
        uVar14 = local_70;
        uVar8 = local_3c;
        if (bVar16) goto LAB_001094b8;
      }
      local_70 = uVar14;
    } while (uVar6 == 0);
    if (uVar6 != 5) {
      uVar14 = -(uint)(uVar6 != 0) | uVar14;
    }
  }
  return uVar14;
}

Assistant:

int lzcompressor::enumerate_lz_decisions(uint ofs, const state& cur_state, lzham::vector<lzpriced_decision>& decisions, uint min_match_len, uint max_match_len)
   {
      LZHAM_ASSERT(min_match_len >= 1);

      uint start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();
      LZHAM_ASSERT(ofs >= start_ofs);
      const uint lookahead_ofs = ofs - start_ofs;

      uint largest_index = 0;
      uint largest_len;
      bit_cost_t largest_cost;

      if (min_match_len <= 1)
      {
         if (!decisions.try_resize(1))
         {
            LZHAM_LOG_ERROR(7038);
            return -1;
         }

         lzpriced_decision& lit_dec = decisions[0];
         lit_dec.init(ofs, 0, 0, 0);
         lit_dec.m_cost = cur_state.get_cost(*this, m_accel, lit_dec);
         largest_cost = lit_dec.m_cost;

         largest_len = 1;
      }
      else
      {
         if (!decisions.try_resize(0))
         {
            LZHAM_LOG_ERROR(7039);
            return -1;
         }

         largest_len = 0;
         largest_cost = cBitCostMax;
      }

      uint match_hist_max_len = 0;

      // Add rep matches.
      for (uint i = 0; i < cMatchHistSize; i++)
      {
         uint hist_match_len = m_accel.get_match_len(lookahead_ofs, cur_state.m_match_hist[i], max_match_len);
         if (hist_match_len < min_match_len)
            continue;

         if ( ((hist_match_len == 1) && (i == 0)) || (hist_match_len >= CLZBase::cMinMatchLen) )
         {
            match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

            lzpriced_decision dec(ofs, hist_match_len, -((int)i + 1));
            dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

            if (!decisions.try_push_back(dec))
            {
               LZHAM_LOG_ERROR(7040);
               return -1;
            }

            if ( (hist_match_len > largest_len) || ((hist_match_len == largest_len) && (dec.m_cost < largest_cost)) )
            {
               largest_index = decisions.size() - 1;
               largest_len = hist_match_len;
               largest_cost = dec.m_cost;
            }
         }
      }

      // Now add full matches.
      if ((max_match_len >= CLZBase::cMinMatchLen) && (match_hist_max_len < m_fast_bytes))
      {
         const dict_match* pMatches = m_accel.find_matches(lookahead_ofs);

         if (pMatches)
         {
            for ( ; ; )
            {
               uint match_len = math::minimum(pMatches->get_len(), max_match_len);
               LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));

               // Full matches are very likely to be more expensive than rep matches of the same length, so don't bother evaluating them.
               if ((match_len >= min_match_len) && (match_len > match_hist_max_len))
               {
                  if ((max_match_len > CLZBase::cMaxMatchLen) && (match_len == CLZBase::cMaxMatchLen))
                  {
                     match_len = m_accel.get_match_len(lookahead_ofs, pMatches->get_dist(), max_match_len, CLZBase::cMaxMatchLen);
                  }

                  lzpriced_decision dec(ofs, match_len, pMatches->get_dist());
                  dec.m_cost = cur_state.get_cost(*this, m_accel, dec);

                  if (!decisions.try_push_back(dec))
                  {
                     LZHAM_LOG_ERROR(7041);
                     return -1;
                  }

                  if ( (match_len > largest_len) || ((match_len == largest_len) && (dec.get_cost() < largest_cost)) )
                  {
                     largest_index = decisions.size() - 1;
                     largest_len = match_len;
                     largest_cost = dec.get_cost();
                  }
               }
               if (pMatches->is_last())
                  break;
               pMatches++;
            }
         }
      }

      return largest_index;
   }